

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void __thiscall CMU462::DynamicScene::Scene::resample_selected_mesh(Scene *this)

{
  long in_RDI;
  Mesh *m;
  long local_28;
  Mesh *this_00;
  
  if ((*(long *)(in_RDI + 0x30) != 0) && (*(long *)(in_RDI + 0x38) != 0)) {
    this_00 = *(Mesh **)(in_RDI + 0x30);
    if (this_00 == (Mesh *)0x0) {
      local_28 = 0;
    }
    else {
      local_28 = __dynamic_cast(this_00,&SceneObject::typeinfo,&Mesh::typeinfo,0);
    }
    if (local_28 != 0) {
      Mesh::resample(this_00);
    }
    clearSelections((Scene *)this_00);
  }
  return;
}

Assistant:

void Scene::resample_selected_mesh() {
  if (selected.object == nullptr || selected.element == nullptr) return;
  Mesh *m = dynamic_cast<Mesh *>(selected.object);
  if (m) m->resample();
  clearSelections();
}